

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_index_build(char *fn,int min_shift)

{
  htsFile *fp_00;
  hts_idx_t *idx_00;
  hts_idx_t *idx;
  htsFile *fp;
  int min_shift_local;
  char *fn_local;
  
  fp_00 = hts_open(fn,"rb");
  if (fp_00 == (htsFile *)0x0) {
    fn_local._4_4_ = -1;
  }
  else if ((fp_00->format).compression == bgzf) {
    idx_00 = bcf_index(fp_00,min_shift);
    hts_close(fp_00);
    if (idx_00 == (hts_idx_t *)0x0) {
      fn_local._4_4_ = -1;
    }
    else {
      hts_idx_save(idx_00,fn,0);
      hts_idx_destroy(idx_00);
      fn_local._4_4_ = 0;
    }
  }
  else {
    hts_close(fp_00);
    fn_local._4_4_ = -1;
  }
  return fn_local._4_4_;
}

Assistant:

int bcf_index_build(const char *fn, int min_shift)
{
    htsFile *fp;
    hts_idx_t *idx;
    if ((fp = hts_open(fn, "rb")) == 0) return -1;
    if ( fp->format.compression!=bgzf ) { hts_close(fp); return -1; }
    idx = bcf_index(fp, min_shift);
    hts_close(fp);
    if ( !idx ) return -1;
    hts_idx_save(idx, fn, HTS_FMT_CSI);
    hts_idx_destroy(idx);
    return 0;
}